

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fShaderMatrixTests.cpp
# Opt level: O1

void deqp::gles2::Functional::MatrixCaseUtils::Evaluator<14,_0,_9,_2,_9>::evaluate
               (ShaderEvalContext *evalCtx)

{
  undefined8 uVar1;
  int i;
  float *pfVar2;
  undefined4 *puVar3;
  int row;
  long lVar4;
  long lVar5;
  long lVar6;
  undefined4 uVar7;
  Vector<float,_3> res;
  Vector<float,_3> res_1;
  Mat3 m;
  Vec4 *local_b0;
  undefined8 local_a8;
  float local_a0 [5];
  Matrix<float,_3,_3> local_8c;
  Matrix<float,_3,_3> local_68;
  Matrix<float,_3,_3> local_38;
  
  pfVar2 = (float *)&local_38;
  local_38.m_data.m_data[1].m_data[1] = 0.0;
  local_38.m_data.m_data[1].m_data[2] = 0.0;
  local_38.m_data.m_data[2].m_data[0] = 0.0;
  local_38.m_data.m_data[2].m_data[1] = 0.0;
  local_38.m_data.m_data[0].m_data[0] = 0.0;
  local_38.m_data.m_data[0].m_data[1] = 0.0;
  local_38.m_data.m_data[0].m_data[2] = 0.0;
  local_38.m_data.m_data[1].m_data[0] = 0.0;
  local_38.m_data.m_data[2].m_data[2] = 0.0;
  puVar3 = &s_constInMat3;
  lVar4 = 0;
  do {
    lVar5 = 0;
    do {
      *(undefined4 *)((long)pfVar2 + lVar5) = *(undefined4 *)((long)puVar3 + lVar5);
      lVar5 = lVar5 + 0xc;
    } while (lVar5 != 0x24);
    lVar4 = lVar4 + 1;
    pfVar2 = pfVar2 + 1;
    puVar3 = puVar3 + 1;
  } while (lVar4 != 3);
  pfVar2 = (float *)&local_68;
  lVar4 = 0;
  lVar5 = 0;
  do {
    lVar6 = 0;
    do {
      uVar7 = 0x3f800000;
      if (lVar4 != lVar6) {
        uVar7 = 0;
      }
      *(undefined4 *)((long)pfVar2 + lVar6) = uVar7;
      lVar6 = lVar6 + 0xc;
    } while (lVar6 != 0x24);
    lVar5 = lVar5 + 1;
    pfVar2 = pfVar2 + 1;
    lVar4 = lVar4 + 0xc;
  } while (lVar5 != 3);
  local_68.m_data.m_data[0].m_data._0_8_ = *(undefined8 *)evalCtx->in[0].m_data;
  local_68.m_data.m_data[0].m_data[2] = evalCtx->in[0].m_data[2];
  uVar1 = *(undefined8 *)evalCtx->in[1].m_data;
  local_68.m_data.m_data[1].m_data[2] = evalCtx->in[1].m_data[2];
  local_68.m_data.m_data[1].m_data[0] = (float)uVar1;
  local_68.m_data.m_data[1].m_data[1] = (float)((ulong)uVar1 >> 0x20);
  local_68.m_data.m_data[2].m_data._0_8_ = *(undefined8 *)evalCtx->in[2].m_data;
  local_68.m_data.m_data[2].m_data[2] = evalCtx->in[2].m_data[2];
  tcu::operator/(&local_8c,&local_38,&local_68);
  local_a8 = (ulong)local_a8._4_4_ << 0x20;
  local_b0 = (Vec4 *)0x0;
  lVar4 = 0;
  do {
    *(float *)((long)&local_b0 + lVar4 * 4) =
         local_8c.m_data.m_data[0].m_data[lVar4] + local_8c.m_data.m_data[1].m_data[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  local_a0[4] = 0.0;
  local_a0[2] = 0.0;
  local_a0[3] = 0.0;
  lVar4 = 0;
  do {
    local_a0[lVar4 + 2] =
         *(float *)((long)&local_b0 + lVar4 * 4) +
         *(float *)((long)(local_68.m_data.m_data + -1) + lVar4 * 4);
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  local_b0 = &evalCtx->color;
  local_a8 = 0x100000000;
  local_a0[0] = 2.8026e-45;
  lVar4 = 2;
  do {
    (evalCtx->color).m_data[*(int *)((long)&local_b0 + lVar4 * 4)] = local_a0[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 5);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx)
	{
		evalCtx.color.xyz() = reduceToVec3(getInputValue<In0Type, In0DataType>(evalCtx, 0) / getInputValue<In1Type, In1DataType>(evalCtx, 1));
	}